

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesDeviceEnumLeds(zes_device_handle_t hDevice,uint32_t *pCount,zes_led_handle_t *phLed)

{
  object_t<_zes_led_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_48;
  size_t i;
  zes_pfnDeviceEnumLeds_t pfnEnumLeds;
  dditable_t *dditable;
  zes_led_handle_t *pp_Stack_28;
  ze_result_t result;
  zes_led_handle_t *phLed_local;
  uint32_t *pCount_local;
  zes_device_handle_t hDevice_local;
  
  dditable._4_4_ = 0;
  pfnEnumLeds = *(zes_pfnDeviceEnumLeds_t *)(hDevice + 8);
  if (*(code **)(pfnEnumLeds + 0x900) == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pCount_local = *(uint32_t **)hDevice;
    pp_Stack_28 = phLed;
    phLed_local = (zes_led_handle_t *)pCount;
    dditable._4_4_ = (**(code **)(pfnEnumLeds + 0x900))(pCount_local,pCount,phLed);
    hDevice_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_48 = 0;
      while( true ) {
        bVar2 = false;
        if (pp_Stack_28 != (zes_led_handle_t *)0x0) {
          bVar2 = local_48 < *(uint *)phLed_local;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_zes_led_handle_t*>,_zes_led_handle_t*>::
                 getInstance<_zes_led_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_zes_led_handle_t*>,_zes_led_handle_t*> *)
                            (context + 0xae0),pp_Stack_28 + local_48,(dditable_t **)&pfnEnumLeds);
        pp_Stack_28[local_48] = (zes_led_handle_t)poVar1;
        local_48 = local_48 + 1;
      }
      hDevice_local._4_4_ = dditable._4_4_;
    }
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumLeds(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_led_handle_t* phLed                         ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_device_object_t*>( hDevice )->dditable;
        auto pfnEnumLeds = dditable->zes.Device.pfnEnumLeds;
        if( nullptr == pfnEnumLeds )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zes_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnEnumLeds( hDevice, pCount, phLed );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phLed ) && ( i < *pCount ); ++i )
                phLed[ i ] = reinterpret_cast<zes_led_handle_t>(
                    context->zes_led_factory.getInstance( phLed[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }